

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O0

bool ConvertToInt(char *str,int defaultrad,size_t len,int *Result)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int local_38;
  int l;
  int r;
  int val;
  int *Result_local;
  size_t len_local;
  char *pcStack_18;
  int defaultrad_local;
  char *str_local;
  
  l = 0;
  Result_local = (int *)len;
  if (len == 0) {
    Result_local = (int *)strlen(str);
  }
  if ((*str == '0') && ((str[1] == 'x' || (str[1] == 'X')))) {
    local_38 = 0x10;
    pcStack_18 = str + 2;
    Result_local = (int *)((long)Result_local + -2);
  }
  else if (*str == '$') {
    local_38 = 0x10;
    pcStack_18 = str + 1;
    Result_local = (int *)((long)Result_local + -1);
  }
  else if ((*str == '0') && (str[1] == 'o')) {
    local_38 = 8;
    pcStack_18 = str + 2;
    Result_local = (int *)((long)Result_local + -2);
  }
  else {
    if ((*str < '0') || ('9' < *str)) {
      return false;
    }
    pcStack_18 = str;
    if (str[(long)Result_local + -1] == 'b') {
      local_38 = 2;
      Result_local = (int *)((long)Result_local + -1);
    }
    else if (str[(long)Result_local + -1] == 'o') {
      local_38 = 8;
      Result_local = (int *)((long)Result_local + -1);
    }
    else {
      local_38 = defaultrad;
      if (str[(long)Result_local + -1] == 'h') {
        local_38 = 0x10;
        Result_local = (int *)((long)Result_local + -1);
      }
    }
  }
  switch(local_38) {
  case 2:
    while (piVar3 = (int *)((long)Result_local + -1), Result_local != (int *)0x0) {
      if ((*pcStack_18 != '0') && (*pcStack_18 != '1')) {
        return false;
      }
      l = l * 2;
      pcVar4 = pcStack_18 + 1;
      cVar1 = *pcStack_18;
      Result_local = piVar3;
      pcStack_18 = pcVar4;
      if (cVar1 == '1') {
        l = l + 1;
      }
    }
    break;
  default:
    return false;
  case 8:
    while (Result_local != (int *)0x0) {
      if ((*pcStack_18 < '0') || ('7' < *pcStack_18)) {
        return false;
      }
      l = *pcStack_18 + -0x30 + l * 8;
      Result_local = (int *)((long)Result_local + -1);
      pcStack_18 = pcStack_18 + 1;
    }
    break;
  case 10:
    while (Result_local != (int *)0x0) {
      if ((*pcStack_18 < '0') || ('9' < *pcStack_18)) {
        return false;
      }
      l = *pcStack_18 + -0x30 + l * 10;
      Result_local = (int *)((long)Result_local + -1);
      pcStack_18 = pcStack_18 + 1;
    }
    break;
  case 0x10:
    while (Result_local != (int *)0x0) {
      if ((((*pcStack_18 < '0') || ('9' < *pcStack_18)) &&
          ((*pcStack_18 < 'A' || ('F' < *pcStack_18)))) &&
         ((*pcStack_18 < 'a' || ('f' < *pcStack_18)))) {
        return false;
      }
      iVar2 = htd(*pcStack_18);
      if (iVar2 < 0) {
        return false;
      }
      l = iVar2 + l * 0x10;
      Result_local = (int *)((long)Result_local + -1);
      pcStack_18 = pcStack_18 + 1;
    }
  }
  *Result = l;
  return true;
}

Assistant:

bool ConvertToInt(char* str, int defaultrad, size_t len, int& Result)
{
	int val = 0;
	int r = 0;
	if (len == 0) len = strlen(str);

	if (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))
	{
		r = 16;
		str+=2;
		len-=2;
	} else if (str[0] == '$')
	{
		r = 16;
		str++;
		len--;
	} else if (str[0] == '0' && str[1] == 'o')
	{
		r = 8;
		str+=2;
		len-=2;
	} else {
		if (!(str[0] >= '0' && str[0] <= '9')) return false;

		if (str[len-1] == 'b')
		{
			r = 2;
			len--;
		} else if (str[len-1] == 'o')
		{
			r = 8;
			len--;
		} else if (str[len-1] == 'h')
		{
			r = 16;
			len--;
		} else {
			r = defaultrad;
		}
	}

	switch (r)
	{
	case 2: // bin
		while (len--)
		{
			if (*str != '0' && *str != '1') return false;
			val = val << 1;
			if (*str++ == '1')
			{
				val++;
			}
		}
		break;
	case 8: // oct
		while (len--)
		{
			if (*str < '0' || *str > '7') return false;
			val = val << 3;
			val+=(*str++-'0');
		}
		break;
	case 10: // dec
		while (len--)
		{
			if (*str < '0' || *str > '9') return false;
			val = val * 10;
			val += (*str++ - '0');
		}
		break;
	case 16: // hex
		while (len--)
		{
			if ((*str < '0' || *str > '9') && (*str < 'A' || *str > 'F') && (*str < 'a' || *str > 'f')) return false;
			int l = htd(*str++);
			if (l >= 0)
			{
				val = val << 4;
				val += l;
			} else {
				return false;
			}
		}
		break;
	default:
		return false;
	}
	Result = val;
	return true;
}